

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall wabt::ObjdumpNames::Set(ObjdumpNames *this,Index index,string_view name)

{
  size_type sVar1;
  reference this_00;
  string_view local_48 [2];
  uint local_24;
  ObjdumpNames *pOStack_20;
  Index index_local;
  ObjdumpNames *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (ObjdumpNames *)name.data_;
  local_24 = index;
  pOStack_20 = this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->names);
  if (sVar1 <= local_24) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->names,(ulong)(local_24 + 1));
  }
  string_view::to_string_abi_cxx11_(local_48);
  this_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->names,(ulong)local_24);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void ObjdumpNames::Set(Index index, string_view name) {
  if (names.size() <= index) {
    names.resize(index + 1);
  }
  names[index] = name.to_string();
}